

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  uint options_local;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream_local;
  xml_document *this_local;
  
  reset(this);
  impl::anon_unknown_0::load_stream_impl<wchar_t>
            (__return_storage_ptr__,(xml_document_struct *)(this->super_xml_node)._root,stream,
             options,encoding_wchar,&this->_buffer);
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}